

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkInterface * __thiscall
cmGeneratorTarget::GetLinkInterface
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head,bool secondPass)

{
  bool bVar1;
  TargetType TVar2;
  pointer ppVar3;
  cmGeneratorTarget *local_160;
  byte local_151;
  cmOptionalLinkInterface local_148;
  cmGeneratorTarget *local_50;
  cmOptionalLinkInterface *iface;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_> local_40;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *local_38;
  cmHeadToLinkInterfaceMap *hm;
  cmGeneratorTarget *pcStack_28;
  bool secondPass_local;
  cmGeneratorTarget *head_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  hm._7_1_ = secondPass;
  pcStack_28 = head;
  head_local = (cmGeneratorTarget *)config;
  config_local = (string *)this;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmGeneratorTarget *)
                 GetImportLinkInterface
                           (this,(string *)head_local,pcStack_28,Link,(bool)(hm._7_1_ & 1));
  }
  else {
    TVar2 = GetType(this);
    if ((TVar2 != EXECUTABLE) || (bVar1 = IsExecutableWithExports(this), bVar1)) {
      local_38 = &GetHeadToLinkInterfaceMap(this,(string *)head_local)->
                  super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
      bVar1 = std::
              map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
              ::empty(local_38);
      local_151 = 0;
      if (!bVar1) {
        local_40._M_node =
             (_Base_ptr)
             std::
             map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
             ::begin(local_38);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                 ::operator->(&local_40);
        local_151 = (ppVar3->second).super_cmLinkInterface.super_cmLinkInterfaceLibraries.
                    HadHeadSensitiveCondition ^ 0xff;
      }
      if ((local_151 & 1) != 0) {
        iface = (cmOptionalLinkInterface *)
                std::
                map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                ::begin(local_38);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                               *)&iface);
        pcStack_28 = ppVar3->first;
      }
      local_50 = (cmGeneratorTarget *)
                 std::
                 map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                 ::operator[](local_38,&stack0xffffffffffffffd8);
      if ((hm._7_1_ & 1) != 0) {
        memset(&local_148,0,0xf8);
        cmOptionalLinkInterface::cmOptionalLinkInterface(&local_148);
        cmOptionalLinkInterface::operator=((cmOptionalLinkInterface *)local_50,&local_148);
        cmOptionalLinkInterface::~cmOptionalLinkInterface(&local_148);
      }
      if (((local_50->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count &
          0x10000) == 0) {
        *(undefined1 *)
         ((long)&(local_50->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header.
                 _M_node_count + 2) = 1;
        ComputeLinkInterfaceLibraries
                  (this,(string *)head_local,(cmOptionalLinkInterface *)local_50,pcStack_28,Link);
      }
      if ((((local_50->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count &
           0x1000000) == 0) &&
         (*(undefined1 *)
           ((long)&(local_50->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count + 3) = 1,
         ((local_50->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count &
         0x100000000) != 0)) {
        ComputeLinkInterface
                  (this,(string *)head_local,(cmOptionalLinkInterface *)local_50,pcStack_28,
                   (bool)(hm._7_1_ & 1));
        ComputeLinkInterfaceRuntimeLibraries
                  (this,(string *)head_local,(cmOptionalLinkInterface *)local_50);
      }
      if (((local_50->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count &
          0x100000000) == 0) {
        local_160 = (cmGeneratorTarget *)0x0;
      }
      else {
        local_160 = local_50;
      }
      this_local = local_160;
    }
    else {
      this_local = (cmGeneratorTarget *)0x0;
    }
  }
  return (cmLinkInterface *)this_local;
}

Assistant:

cmLinkInterface const* cmGeneratorTarget::GetLinkInterface(
  const std::string& config, cmGeneratorTarget const* head,
  bool secondPass) const
{
  // Imported targets have their own link interface.
  if (this->IsImported()) {
    return this->GetImportLinkInterface(config, head, LinkInterfaceFor::Link,
                                        secondPass);
  }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if (this->GetType() == cmStateEnums::EXECUTABLE &&
      !this->IsExecutableWithExports()) {
    return nullptr;
  }

  // Lookup any existing link interface for this configuration.
  cmHeadToLinkInterfaceMap& hm = this->GetHeadToLinkInterfaceMap(config);

  // If the link interface does not depend on the head target
  // then re-use the one from the head we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    head = hm.begin()->first;
  }

  cmOptionalLinkInterface& iface = hm[head];
  if (secondPass) {
    iface = cmOptionalLinkInterface();
  }
  if (!iface.LibrariesDone) {
    iface.LibrariesDone = true;
    this->ComputeLinkInterfaceLibraries(config, iface, head,
                                        LinkInterfaceFor::Link);
  }
  if (!iface.AllDone) {
    iface.AllDone = true;
    if (iface.Exists) {
      this->ComputeLinkInterface(config, iface, head, secondPass);
      this->ComputeLinkInterfaceRuntimeLibraries(config, iface);
    }
  }

  return iface.Exists ? &iface : nullptr;
}